

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O2

void __thiscall xercesc_4_0::QName::setValues(QName *this,QName *qname)

{
  setPrefix(this,qname->fPrefix);
  setLocalPart(this,qname->fLocalPart);
  this->fURIId = qname->fURIId;
  return;
}

Assistant:

void QName::setValues(const QName& qname)
{
    setPrefix(qname.getPrefix());
    setLocalPart(qname.getLocalPart());
    setURI(qname.getURI());
}